

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O2

void absl::lts_20240722::SetAndroidNativeTag(char *tag)

{
  undefined *puVar1;
  __base_type this;
  allocator<char> local_51;
  allocator<char> local_50 [32];
  string death_message;
  
  if (tag == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&death_message,"Check tag failed: ",local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"tag must be non-null.",&local_51);
    std::__cxx11::string::append((string *)&death_message);
    std::__cxx11::string::~string((string *)local_50);
    (*raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/log/globals.cc"
               ,0x8a,&death_message);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/log/globals.cc"
                  ,0x8a,"void absl::SetAndroidNativeTag(const char *)");
  }
  this._M_p = (__pointer_type)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this._M_p,tag,(allocator<char> *)&death_message);
  puVar1 = (anonymous_namespace)::android_log_tag;
  (anonymous_namespace)::android_log_tag = ((this._M_p)->_M_dataplus)._M_p;
  LOCK();
  UNLOCK();
  if (puVar1 == "native") {
    SetAndroidNativeTag(char_const*)::user_log_tag_abi_cxx11_._M_b._M_p =
         (__base_type)(__base_type)this._M_p;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&death_message,
             "Check android_log_tag.exchange(tag_str->c_str(), std::memory_order_acq_rel) == kDefaultAndroidTag failed: "
             ,local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"SetAndroidNativeTag() must only be called once per process!",
             &local_51);
  std::__cxx11::string::append((string *)&death_message);
  std::__cxx11::string::~string((string *)local_50);
  (*raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/log/globals.cc"
             ,0x90,&death_message);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/log/globals.cc"
                ,0x90,"void absl::SetAndroidNativeTag(const char *)");
}

Assistant:

void SetAndroidNativeTag(const char* tag) {
  ABSL_CONST_INIT static std::atomic<const std::string*> user_log_tag(nullptr);
  ABSL_INTERNAL_CHECK(tag, "tag must be non-null.");

  const std::string* tag_str = new std::string(tag);
  ABSL_INTERNAL_CHECK(
      android_log_tag.exchange(tag_str->c_str(), std::memory_order_acq_rel) ==
          kDefaultAndroidTag,
      "SetAndroidNativeTag() must only be called once per process!");
  user_log_tag.store(tag_str, std::memory_order_relaxed);
}